

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void storeA2RGB30PMFromARGB32PM_sse4<(QtPixelOrder)0>
               (uchar *dest,uint *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int i;
  uint *d;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    uVar1 = qConvertArgb32ToA2rgb30_sse4<(QtPixelOrder)0>((QRgb)d);
    *(uint *)(in_RDI + (long)in_EDX * 4 + (long)local_34 * 4) = uVar1;
  }
  return;
}

Assistant:

void QT_FASTCALL storeA2RGB30PMFromARGB32PM_sse4(uchar *dest, const uint *src, int index, int count,
                                                 const QList<QRgb> *, QDitherInfo *)
{
    uint *d = reinterpret_cast<uint *>(dest) + index;
    for (int i = 0; i < count; ++i)
        d[i] = qConvertArgb32ToA2rgb30_sse4<PixelOrder>(src[i]);
}